

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncryptionHelper.cpp
# Opt level: O3

void __thiscall
EncryptionHelper::OnObjectStart
          (EncryptionHelper *this,longlong inObjectID,longlong inGenerationNumber)

{
  _Rb_tree_node_base *p_Var1;
  
  if ((this->mIsDocumentEncrypted == true) && (this->mEncryptionPauseLevel == 0)) {
    for (p_Var1 = (this->mXcrypts)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var1 != &(this->mXcrypts)._M_t._M_impl.super__Rb_tree_header;
        p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
      XCryptionCommon::OnObjectStart_abi_cxx11_
                (*(XCryptionCommon **)(p_Var1 + 2),inObjectID,inGenerationNumber);
    }
  }
  return;
}

Assistant:

void EncryptionHelper::OnObjectStart(long long inObjectID, long long inGenerationNumber) {
	if (!IsEncrypting())
		return;

	StringToXCryptionCommonMap::iterator it = mXcrypts.begin();
	for (; it != mXcrypts.end(); ++it) {
		it->second->OnObjectStart(inObjectID, inGenerationNumber);
	}
}